

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_mediator.hpp
# Opt level: O1

bool __thiscall iutest::TestInfo::Mediator::HasFatalFailure(Mediator *this)

{
  int iVar1;
  TestInfo *pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  bool bVar6;
  
  pTVar2 = (this->super_iuITestInfoMediator).m_test_info;
  pTVar3 = (pTVar2->m_test_result).m_test_part_results.
           super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar4 = (pTVar2->m_test_result).m_test_part_results.
           super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pTVar3 != pTVar4;
  if (bVar6) {
    iVar1 = *(int *)&(pTVar3->super_iuCodeMessage).field_0x2c;
    while (iVar1 != 2) {
      pTVar5 = pTVar3 + 1;
      if (pTVar5 == pTVar4) {
        return pTVar5 != pTVar4;
      }
      iVar1 = *(int *)&pTVar3[1].super_iuCodeMessage.field_0x2c;
      pTVar3 = pTVar5;
    }
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

TestInfo* ptr() const IUTEST_CXX_NOEXCEPT_SPEC { return m_test_info; }